

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

void cmSHA512_Internal_Last(SHA_CTX *context)

{
  cm_sha2_uint8_t *data;
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  
  uVar2 = (context->s512).bitcount[0];
  uVar3 = (context->s512).bitcount[1];
  uVar4 = (uint)(uVar2 >> 3) & 0x7f;
  (context->s512).bitcount[0] =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  (context->s512).bitcount[1] =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  data = (context->s1).buffer + 0x30;
  if ((uVar2 >> 3 & 0x7f) == 0) {
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x38] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x39] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x60] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x61] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x62] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[99] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[100] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x65] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x66] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x67] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x68] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x69] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x50] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x51] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x52] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x53] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x54] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x55] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x56] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x57] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x58] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x59] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x40] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x41] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x42] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x43] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x44] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x45] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x46] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x47] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x48] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x49] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x30] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x31] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x32] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x33] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x34] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x35] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x36] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x37] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x38] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x39] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x20] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x21] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x22] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x23] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x24] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x25] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x26] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x27] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x28] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x29] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x38] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x39] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3f] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x18] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x19] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1f] = '\0';
    *data = 0x80;
  }
  else {
    data[uVar4] = 0x80;
    if (uVar4 < 0x70) {
      memset(data + (uVar4 + 1),0,(ulong)(0x6f - uVar4));
    }
    else {
      if (uVar4 != 0x7f) {
        memset(data + (uVar4 + 1),0,(ulong)(uVar4 ^ 0x7f));
      }
      cmSHA512_Internal_Transform(context,(sha_word64 *)data);
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x60] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x61] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x62] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[99] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[100] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x65] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x66] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x67] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x68] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x69] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x6f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x50] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x51] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x52] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x53] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x54] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x55] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x56] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x57] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x58] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x59] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x5f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x40] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x41] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x42] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x43] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x44] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x45] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x46] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x47] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x48] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x49] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x4f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x30] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x31] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x32] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x33] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x34] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x35] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x36] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x37] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x38] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x39] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x3f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x20] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x21] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x22] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x23] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x24] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x25] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x26] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x27] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x28] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x29] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x2f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x38] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x39] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x28))[0x3f] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x18] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x19] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x50))[0x1f] = '\0';
      data[0] = '\0';
      data[1] = '\0';
      data[2] = '\0';
      data[3] = '\0';
      data[4] = '\0';
      data[5] = '\0';
      data[6] = '\0';
      data[7] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x38] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x39] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3f] = '\0';
    }
  }
  auVar1 = *(undefined1 (*) [16])((context->s1).buffer + 0x20);
  auVar5._0_8_ = auVar1._8_8_;
  auVar5._8_4_ = auVar1._0_4_;
  auVar5._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])((context->s512).buffer + 0x70) = auVar5;
  cmSHA512_Internal_Transform(context,(sha_word64 *)data);
  return;
}

Assistant:

void SHA512_Internal_Last(SHA_CTX* context) {
	unsigned int	usedspace;

	usedspace = (unsigned int)((context->s512.bitcount[0] >> 3) % 128);
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s512.bitcount[0],context->s512.bitcount[0]);
	REVERSE64(context->s512.bitcount[1],context->s512.bitcount[1]);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->s512.buffer[usedspace++] = 0x80;

		if (usedspace <= 112) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s512.buffer[usedspace], 112 - usedspace);
		} else {
			if (usedspace < 128) {
				MEMSET_BZERO(&context->s512.buffer[usedspace], 128 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s512.buffer, 112);
		}
		/* Clean up: */
		usedspace = 0;
	} else {
		/* Prepare for final transform: */
		MEMSET_BZERO(context->s512.buffer, 112);

		/* Begin padding with a 1 bit: */
		*context->s512.buffer = 0x80;
	}
	/* Store the length of input data (in bits): */
	MEMCPY_BCOPY(&context->s512.buffer[112], &context->s512.bitcount[1],
		     sizeof(sha_word64));
	MEMCPY_BCOPY(&context->s512.buffer[120], &context->s512.bitcount[0],
		     sizeof(sha_word64));

	/* Final transform: */
	SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);
}